

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall Analyser::initializeVariable(Analyser *this,char type)

{
  Instruction local_10;
  
  if (type == 'i') {
    local_10._opr = ipush;
    local_10._x = 0;
    local_10._y = 0;
    local_10._paramNum = 1;
    addInstruction(this,&local_10);
  }
  return;
}

Assistant:

void Analyser::initializeVariable(char type) {
	switch (type)
	{
	case 'i':
		addInstruction(Instruction(Operation::ipush, 0));
		break;
	default:
		break;
	}
}